

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnElemSegmentElemExprCount
          (BinaryReaderIR *this,Index index,Index count)

{
  pointer ppEVar1;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)index) {
    std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::reserve
              (&ppEVar1[index]->elem_exprs,(ulong)count);
    return (Result)Ok;
  }
  __assert_fail("index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/binary-reader-ir.cc"
                ,0x431,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExprCount(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExprCount(Index index, Index count) {
  assert(index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[index];
  WABT_TRY
  segment->elem_exprs.reserve(count);
  WABT_CATCH_BAD_ALLOC
  return Result::Ok;
}